

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkAlloc(char *pName,int nObjsAlloc)

{
  Wlc_Ntk_t *pWVar1;
  char *pcVar2;
  int *piVar3;
  Mem_Flex_t *pMVar4;
  Wlc_Obj_t *pWVar5;
  
  pWVar1 = (Wlc_Ntk_t *)calloc(1,0x340);
  if (pName == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = Extra_FileNameGeneric(pName);
  }
  pWVar1->pName = pcVar2;
  if ((pWVar1->vPis).nCap < 0x6f) {
    piVar3 = (pWVar1->vPis).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(0x1bc);
    }
    else {
      piVar3 = (int *)realloc(piVar3,0x1bc);
    }
    (pWVar1->vPis).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_00366b5d;
    (pWVar1->vPis).nCap = 0x6f;
  }
  if ((pWVar1->vPos).nCap < 0x6f) {
    piVar3 = (pWVar1->vPos).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(0x1bc);
    }
    else {
      piVar3 = (int *)realloc(piVar3,0x1bc);
    }
    (pWVar1->vPos).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_00366b5d;
    (pWVar1->vPos).nCap = 0x6f;
  }
  if ((pWVar1->vCis).nCap < 0x6f) {
    piVar3 = (pWVar1->vCis).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(0x1bc);
    }
    else {
      piVar3 = (int *)realloc(piVar3,0x1bc);
    }
    (pWVar1->vCis).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_00366b5d;
    (pWVar1->vCis).nCap = 0x6f;
  }
  if ((pWVar1->vCos).nCap < 0x6f) {
    piVar3 = (pWVar1->vCos).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(0x1bc);
    }
    else {
      piVar3 = (int *)realloc(piVar3,0x1bc);
    }
    (pWVar1->vCos).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_00366b5d;
    (pWVar1->vCos).nCap = 0x6f;
  }
  if ((pWVar1->vFfs).nCap < 0x6f) {
    piVar3 = (pWVar1->vFfs).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(0x1bc);
    }
    else {
      piVar3 = (int *)realloc(piVar3,0x1bc);
    }
    (pWVar1->vFfs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_00366b5d:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pWVar1->vFfs).nCap = 0x6f;
  }
  pMVar4 = Mem_FlexStart();
  pWVar1->pMemFanin = pMVar4;
  pWVar1->nObjsAlloc = nObjsAlloc;
  pWVar5 = (Wlc_Obj_t *)calloc((long)nObjsAlloc,0x18);
  pWVar1->pObjs = pWVar5;
  pWVar1->iObj = 1;
  return pWVar1;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAlloc( char * pName, int nObjsAlloc )
{
    Wlc_Ntk_t * p;
    p = ABC_CALLOC( Wlc_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vPis, 111 );
    Vec_IntGrow( &p->vPos, 111 );
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    p->pMemFanin = Mem_FlexStart();
    p->nObjsAlloc = nObjsAlloc;  
    p->pObjs = ABC_CALLOC( Wlc_Obj_t, p->nObjsAlloc );
    p->iObj = 1;
    return p;
}